

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

int parse_connection_string
              (IOTHUB_PROVISIONED_DEVICE *device_info,IOTHUB_CLIENT_CONFIG *client_config)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  char *pcVar8;
  LOGGER_LOG p_Var9;
  bool bVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *iterator;
  char *initial_pos;
  size_t counter;
  size_t field_cnt;
  size_t tag_index;
  int result;
  IOTHUB_CLIENT_CONFIG *client_config_local;
  IOTHUB_PROVISIONED_DEVICE *device_info_local;
  
  tag_index._4_4_ = 0;
  counter = 0;
  l = (LOGGER_LOG)device_info->connectionString;
  do {
    bVar10 = false;
    if (((l != (LOGGER_LOG)0x0) &&
        (bVar10 = false,
        *l != (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)0x0)) &&
       (bVar10 = false, tag_index._4_4_ == 0)) {
      bVar10 = counter < 3;
    }
    if (!bVar10) {
      return tag_index._4_4_;
    }
    iVar7 = memcmp(l,TEST_HOSTNAME_VALUE,9);
    if (iVar7 == 0) {
      initial_pos = (char *)0x0;
      l = l + 9;
      iterator = (char *)l;
      for (; *l != (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)0x0 &&
             tag_index._4_4_ == 0; l = l + 1) {
        if (*l == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)0x2e) {
          if (client_config->iotHubName == (char *)0x0) {
            pcVar8 = (char *)malloc((size_t)(initial_pos + 1));
            client_config->iotHubName = pcVar8;
            if (pcVar8 == (char *)0x0) {
              p_Var9 = xlogging_get_log_function();
              if (p_Var9 != (LOGGER_LOG)0x0) {
                (*p_Var9)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                          ,"parse_connection_string",0xd6,1,"Failure allocating iothub Name");
              }
              tag_index._4_4_ = 0xd7;
              cleanup_config_object(client_config);
            }
            else {
              memset(client_config->iotHubName,0,(size_t)(initial_pos + 1));
              memcpy(client_config->iotHubName,iterator,(long)l - (long)iterator);
              iterator = (char *)(l + 1);
              initial_pos = (char *)0x0;
            }
          }
        }
        else if (*l == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)0x3b) {
          pcVar8 = (char *)malloc((size_t)(initial_pos + 1));
          client_config->iotHubSuffix = pcVar8;
          if (pcVar8 == (char *)0x0) {
            p_Var9 = xlogging_get_log_function();
            if (p_Var9 != (LOGGER_LOG)0x0) {
              (*p_Var9)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0xe9,1,"Failure allocating iothub suffix");
            }
            tag_index._4_4_ = 0xea;
            cleanup_config_object(client_config);
          }
          else {
            memset(client_config->iotHubSuffix,0,(size_t)(initial_pos + 1));
            memcpy(client_config->iotHubSuffix,iterator,(long)l - (long)iterator);
          }
          break;
        }
        initial_pos = initial_pos + 1;
      }
      counter = counter + 1;
    }
    else {
      iVar7 = memcmp(l,TEST_DEVICEID_VALUE,9);
      if (iVar7 == 0) {
        p_Var9 = l + 9;
        l = p_Var9;
        if (client_config->deviceId == (char *)0x0) {
          initial_pos = (char *)0x0;
          while( true ) {
            bVar10 = false;
            if (*l != (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)0x0) {
              bVar10 = *l != (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                             0x3b;
            }
            if (!bVar10) break;
            initial_pos = initial_pos + 1;
            l = l + 1;
          }
          pcVar8 = (char *)malloc((size_t)(initial_pos + 1));
          client_config->deviceId = pcVar8;
          if (pcVar8 == (char *)0x0) {
            p_Var9 = xlogging_get_log_function();
            if (p_Var9 != (LOGGER_LOG)0x0) {
              (*p_Var9)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0x10a,1,"Failure allocating iothub device id");
            }
            tag_index._4_4_ = 0x10b;
            cleanup_config_object(client_config);
          }
          else {
            memset(client_config->deviceId,0,(size_t)(initial_pos + 1));
            memcpy(client_config->deviceId,p_Var9,(size_t)initial_pos);
          }
        }
        else {
          p_Var9 = xlogging_get_log_function();
          if (p_Var9 != (LOGGER_LOG)0x0) {
            (*p_Var9)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                      ,"parse_connection_string",0x116,1,
                      "invalid value state.  device previously allocated");
          }
          tag_index._4_4_ = 0x117;
        }
        counter = counter + 1;
      }
      else {
        cVar11 = -(l[2] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[2]);
        cVar12 = -(l[3] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[3]);
        cVar13 = -(l[4] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[4]);
        cVar14 = -(l[5] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[5]);
        cVar15 = -(l[6] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[6]);
        cVar16 = -(l[7] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[7]);
        cVar17 = -(l[8] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[8]);
        cVar18 = -(l[9] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                           TEST_SHARED_ACCESS_KEY_VALUE[9]);
        cVar19 = -(l[10] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                            TEST_SHARED_ACCESS_KEY_VALUE[10]);
        cVar20 = -(l[0xb] ==
                  (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                  TEST_SHARED_ACCESS_KEY_VALUE[0xb]);
        cVar21 = -(l[0xc] ==
                  (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                  TEST_SHARED_ACCESS_KEY_VALUE[0xc]);
        cVar22 = -(l[0xd] ==
                  (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                  TEST_SHARED_ACCESS_KEY_VALUE[0xd]);
        cVar23 = -(l[0xe] ==
                  (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                  TEST_SHARED_ACCESS_KEY_VALUE[0xe]);
        bVar24 = -(l[0xf] ==
                  (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                  TEST_SHARED_ACCESS_KEY_VALUE[0xf]);
        auVar1[1] = -(l[1] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                              TEST_SHARED_ACCESS_KEY_VALUE[1]);
        auVar1[0] = -(*l == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                            *TEST_SHARED_ACCESS_KEY_VALUE);
        auVar1[2] = cVar11;
        auVar1[3] = cVar12;
        auVar1[4] = cVar13;
        auVar1[5] = cVar14;
        auVar1[6] = cVar15;
        auVar1[7] = cVar16;
        auVar1[8] = cVar17;
        auVar1[9] = cVar18;
        auVar1[10] = cVar19;
        auVar1[0xb] = cVar20;
        auVar1[0xc] = cVar21;
        auVar1[0xd] = cVar22;
        auVar1[0xe] = cVar23;
        auVar1[0xf] = bVar24;
        auVar2[1] = -(l[1] == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                              TEST_SHARED_ACCESS_KEY_VALUE[1]);
        auVar2[0] = -(*l == (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                            *TEST_SHARED_ACCESS_KEY_VALUE);
        auVar2[2] = cVar11;
        auVar2[3] = cVar12;
        auVar2[4] = cVar13;
        auVar2[5] = cVar14;
        auVar2[6] = cVar15;
        auVar2[7] = cVar16;
        auVar2[8] = cVar17;
        auVar2[9] = cVar18;
        auVar2[10] = cVar19;
        auVar2[0xb] = cVar20;
        auVar2[0xc] = cVar21;
        auVar2[0xd] = cVar22;
        auVar2[0xe] = cVar23;
        auVar2[0xf] = bVar24;
        auVar6[1] = cVar12;
        auVar6[0] = cVar11;
        auVar6[2] = cVar13;
        auVar6[3] = cVar14;
        auVar6[4] = cVar15;
        auVar6[5] = cVar16;
        auVar6[6] = cVar17;
        auVar6[7] = cVar18;
        auVar6[8] = cVar19;
        auVar6[9] = cVar20;
        auVar6[10] = cVar21;
        auVar6[0xb] = cVar22;
        auVar6[0xc] = cVar23;
        auVar6[0xd] = bVar24;
        auVar5[1] = cVar13;
        auVar5[0] = cVar12;
        auVar5[2] = cVar14;
        auVar5[3] = cVar15;
        auVar5[4] = cVar16;
        auVar5[5] = cVar17;
        auVar5[6] = cVar18;
        auVar5[7] = cVar19;
        auVar5[8] = cVar20;
        auVar5[9] = cVar21;
        auVar5[10] = cVar22;
        auVar5[0xb] = cVar23;
        auVar5[0xc] = bVar24;
        auVar4[1] = cVar14;
        auVar4[0] = cVar13;
        auVar4[2] = cVar15;
        auVar4[3] = cVar16;
        auVar4[4] = cVar17;
        auVar4[5] = cVar18;
        auVar4[6] = cVar19;
        auVar4[7] = cVar20;
        auVar4[8] = cVar21;
        auVar4[9] = cVar22;
        auVar4[10] = cVar23;
        auVar4[0xb] = bVar24;
        auVar3[1] = cVar15;
        auVar3[0] = cVar14;
        auVar3[2] = cVar16;
        auVar3[3] = cVar17;
        auVar3[4] = cVar18;
        auVar3[5] = cVar19;
        auVar3[6] = cVar20;
        auVar3[7] = cVar21;
        auVar3[8] = cVar22;
        auVar3[9] = cVar23;
        auVar3[10] = bVar24;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21
                                                  ,CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21
                                                  ,CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar24 >> 7) << 0xf) == 0xffff) {
          p_Var9 = l + 0x10;
          l = p_Var9;
          if (client_config->deviceKey == (char *)0x0) {
            initial_pos = (char *)0x0;
            while( true ) {
              bVar10 = false;
              if (*l != (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)0x0) {
                bVar10 = *l != (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                               0x3b;
              }
              if (!bVar10) break;
              initial_pos = initial_pos + 1;
              l = l + 1;
            }
            pcVar8 = (char *)malloc((size_t)(initial_pos + 1));
            client_config->deviceKey = pcVar8;
            if (pcVar8 == (char *)0x0) {
              p_Var9 = xlogging_get_log_function();
              if (p_Var9 != (LOGGER_LOG)0x0) {
                (*p_Var9)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                          ,"parse_connection_string",0x12a,1,"Failure allocating iothub device key")
                ;
              }
              tag_index._4_4_ = 299;
              cleanup_config_object(client_config);
            }
            else {
              memset(client_config->deviceKey,0,(size_t)(initial_pos + 1));
              memcpy(client_config->deviceKey,p_Var9,(size_t)initial_pos);
            }
          }
          counter = counter + 1;
        }
      }
    }
    l = l + 1;
  } while( true );
}

Assistant:

static int parse_connection_string(const IOTHUB_PROVISIONED_DEVICE* device_info, IOTHUB_CLIENT_CONFIG* client_config)
{
    int result = 0;
    size_t tag_index = 0;
    size_t field_cnt = 0;
    size_t counter = 0;
    const char* initial_pos = NULL;
    const char* iterator = device_info->connectionString;
    while (iterator != NULL && *iterator != '\0' && result == 0 && field_cnt < 3)
    {
        if (memcmp(iterator, TEST_HOSTNAME_VALUE, TEST_HOSTNAME_VALUE_LEN) == 0)
        {
            counter = 0;
            iterator += TEST_HOSTNAME_VALUE_LEN;
            initial_pos = iterator;
            // Loop here and break up the hostname into it's parts
            while (*iterator != '\0' && result == 0)
            {
                if (*iterator == '.')
                {
                    if (client_config->iotHubName == NULL)
                    {
                        if ((client_config->iotHubName = (const char*)malloc(counter + 1)) == NULL)
                        {
                            LogError("Failure allocating iothub Name");
                            result = MU_FAILURE;
                            cleanup_config_object(client_config);
                        }
                        else
                        {
                            memset((char*)client_config->iotHubName, 0, counter + 1);
                            memcpy((char*)client_config->iotHubName, initial_pos, iterator - initial_pos);
                            // Change the initial position to the current pos beyond the .
                            initial_pos = iterator+1;
                            counter = 0;
                        }
                    }
                }
                else if (*iterator == ';')
                {
                    // Now get the suffix
                    if ((client_config->iotHubSuffix = (const char*)malloc(counter+1)) == NULL)
                    {
                        LogError("Failure allocating iothub suffix");
                        result = MU_FAILURE;
                        cleanup_config_object(client_config);
                    }
                    else
                    {
                        memset((char*)client_config->iotHubSuffix, 0, counter + 1);
                        memcpy((char*)client_config->iotHubSuffix, initial_pos, iterator - initial_pos);
                        initial_pos = iterator + 1;
                        counter = 0;
                    }
                    break;
                }
                iterator++;
                counter++;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_DEVICEID_VALUE, TEST_DEVICEID_VALUE_LEN) == 0)
        {
            iterator += TEST_DEVICEID_VALUE_LEN;
            if (client_config->deviceId == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceId = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device id");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceId, 0, counter + 1);
                    memcpy((char*)client_config->deviceId, initial_pos, counter);
                }
            }
            else
            {
                LogError("invalid value state.  device previously allocated");
                result = MU_FAILURE;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_SHARED_ACCESS_KEY_VALUE, TEST_SHARED_ACCESS_KEY_LEN) == 0)
        {
            iterator += TEST_SHARED_ACCESS_KEY_LEN;
            if (client_config->deviceKey == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceKey = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device key");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceKey, 0, counter + 1);
                    memcpy((char*)client_config->deviceKey, initial_pos, counter);
                }
            }
            field_cnt++;
        }
        iterator++;
    }
    return result;
}